

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void soul::SanityCheckPass::checkOverallStructureOfProcessor(ProcessorBase *processorOrGraph)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pool_ref<soul::AST::EndpointDeclaration> *e;
  undefined4 extraout_var;
  long *plVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  long *extraout_RDX;
  long *extraout_RDX_00;
  long *extraout_RDX_01;
  Identifier *in_R9;
  undefined1 auVar8 [16];
  string_view other;
  string_view other_00;
  string_view other_01;
  undefined1 local_160 [4];
  int local_15c;
  Structure *local_150;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  long *plVar6;
  
  iVar3 = (*(processorOrGraph->super_ModuleBase).super_ASTObject._vptr_ASTObject[8])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar5 != extraout_RDX) {
    lVar7 = 0;
    do {
      lVar7 = lVar7 + ((ulong)*(byte *)(*plVar5 + 0x28) ^ 1);
      plVar5 = plVar5 + 1;
    } while (plVar5 != extraout_RDX);
    if (lVar7 != 0) {
      iVar3 = 0;
      plVar5 = (long *)__dynamic_cast(processorOrGraph,&AST::ProcessorBase::typeinfo,
                                      &AST::Processor::typeinfo,0);
      if (plVar5 != (long *)0x0) {
        auVar8 = (**(code **)(*plVar5 + 0xb0))();
        plVar6 = auVar8._0_8_;
        if (plVar6 != auVar8._8_8_) {
          iVar3 = 0;
          do {
            other._M_str = "run";
            other._M_len = 3;
            bVar1 = Identifier::operator==((Identifier *)(*plVar6 + 0x38),other);
            if ((bVar1) ||
               (other_00._M_str = "init", other_00._M_len = 4,
               bVar1 = Identifier::operator==((Identifier *)(*plVar6 + 0x38),other_00), bVar1)) {
              if (*(long **)(*plVar6 + 0x30) == (long *)0x0) {
                throwInternalCompilerError("object != nullptr","operator->",0x3c);
              }
              (**(code **)(**(long **)(*plVar6 + 0x30) + 0x28))(local_160);
              iVar4 = local_15c;
              RefCountedPtr<soul::Structure>::decIfNotNull(local_150);
              lVar7 = *plVar6;
              if (iVar4 != 1) {
                CompileMessageHelpers::createMessage<soul::Identifier&>
                          (&local_a0,(CompileMessageHelpers *)0x1,none,0x2858bb,
                           (char *)(lVar7 + 0x38),in_R9);
                AST::Context::throwError((Context *)(lVar7 + 0x10),&local_a0,false);
              }
              if (*(long *)(lVar7 + 0x58) != *(long *)(lVar7 + 0x60)) {
                CompileMessageHelpers::createMessage<soul::Identifier&>
                          (&local_d8,(CompileMessageHelpers *)0x1,none,0x2858e1,
                           (char *)(lVar7 + 0x38),in_R9);
                AST::Context::throwError((Context *)(lVar7 + 0x10),&local_d8,false);
              }
              other_01._M_str = "run";
              other_01._M_len = 3;
              bVar1 = Identifier::operator==((Identifier *)(lVar7 + 0x38),other_01);
              iVar3 = iVar3 + (uint)bVar1;
            }
            plVar6 = plVar6 + 1;
          } while (plVar6 != auVar8._8_8_);
        }
        if (iVar3 == 0) {
          iVar4 = (*(processorOrGraph->super_ModuleBase).super_ASTObject._vptr_ASTObject[8])();
          plVar6 = (long *)CONCAT44(extraout_var_00,iVar4);
          bVar1 = plVar6 == extraout_RDX_00;
          if (((!bVar1) && (*(EndpointDetails **)(*plVar6 + 0x38) != (EndpointDetails *)0x0)) &&
             (bVar2 = AST::EndpointDetails::isResolved(*(EndpointDetails **)(*plVar6 + 0x38)), bVar2
             )) {
            do {
              plVar6 = plVar6 + 1;
              bVar1 = plVar6 == extraout_RDX_00;
              if ((bVar1) || (*(EndpointDetails **)(*plVar6 + 0x38) == (EndpointDetails *)0x0))
              break;
              bVar2 = AST::EndpointDetails::isResolved(*(EndpointDetails **)(*plVar6 + 0x38));
            } while (bVar2);
          }
          if (bVar1) {
            iVar4 = (*(processorOrGraph->super_ModuleBase).super_ASTObject._vptr_ASTObject[8])();
            for (plVar6 = (long *)CONCAT44(extraout_var_01,iVar4); plVar6 != extraout_RDX_01;
                plVar6 = plVar6 + 1) {
              if (*(int **)(*plVar6 + 0x38) == (int *)0x0) {
                throwInternalCompilerError("object != nullptr","operator*",0x3b);
              }
              if (**(int **)(*plVar6 + 0x38) == 3) break;
            }
            if (plVar6 == extraout_RDX_01) {
              CompileMessageHelpers::createMessage<>
                        (&local_110,syntax,error,"A processor must contain a run() function");
              AST::Context::throwError((Context *)(plVar5 + 2),&local_110,false);
            }
          }
        }
        if (1 < iVar3) {
          CompileMessageHelpers::createMessage<>
                    (&local_148,syntax,error,
                     "A processor cannot contain more than one run() function");
          AST::Context::throwError((Context *)(plVar5 + 2),&local_148,false);
        }
      }
      return;
    }
  }
  CompileMessageHelpers::createMessage<>
            (&local_68,syntax,error,"A processor must declare at least one output");
  AST::Context::throwError
            (&(processorOrGraph->super_ModuleBase).super_ASTObject.context,&local_68,false);
}

Assistant:

static void checkOverallStructureOfProcessor (AST::ProcessorBase& processorOrGraph)
    {
        if (processorOrGraph.getNumOutputs() == 0)
            processorOrGraph.context.throwError (Errors::processorNeedsAnOutput());

        if (auto processor = cast<AST::Processor> (processorOrGraph))
        {
            int numRunFunctions = 0;

            for (auto& f : processor->getFunctions())
            {
                if (f->isRunFunction() || f->isUserInitFunction())
                {
                    if (! f->returnType->resolveAsType().isVoid())
                        f->context.throwError (Errors::functionMustBeVoid (f->name));

                    if (! f->parameters.empty())
                        f->context.throwError (Errors::functionHasParams (f->name));

                    if (f->isRunFunction())
                        ++numRunFunctions;
                }
            }

            // If the processor has non-event I/O then we need a run processor
            if (numRunFunctions == 0)
            {
                auto areAllEndpointsResolved = [&]
                {
                    for (auto e : processorOrGraph.getEndpoints())
                        if (! e->isResolved())
                            return false;

                    return true;
                };

                auto hasAnEventEndpoint = [&]
                {
                    for (auto e : processorOrGraph.getEndpoints())
                        if (isEvent (e->getDetails()))
                            return true;

                    return false;
                };

                if (areAllEndpointsResolved() && ! hasAnEventEndpoint())
                    processor->context.throwError (Errors::processorNeedsRunFunction());
            }

            if (numRunFunctions > 1)
                processor->context.throwError (Errors::multipleRunFunctions());
        }
    }